

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O2

int FreeEXRImage(EXRImage *exr_image)

{
  uchar **ppuVar1;
  int i_1;
  long lVar2;
  int i;
  long lVar3;
  
  if (exr_image != (EXRImage *)0x0) {
    if (exr_image->next_level != (EXRImage *)0x0) {
      FreeEXRImage(exr_image->next_level);
      operator_delete(exr_image->next_level);
    }
    for (lVar3 = 0; ppuVar1 = exr_image->images, lVar3 < exr_image->num_channels; lVar3 = lVar3 + 1)
    {
      if (ppuVar1 != (uchar **)0x0) {
        free(ppuVar1[lVar3]);
      }
    }
    free(ppuVar1);
    if (exr_image->tiles != (EXRTile *)0x0) {
      for (lVar3 = 0; lVar3 < exr_image->num_tiles; lVar3 = lVar3 + 1) {
        for (lVar2 = 0; ppuVar1 = exr_image->tiles[lVar3].images, lVar2 < exr_image->num_channels;
            lVar2 = lVar2 + 1) {
          if (ppuVar1 != (uchar **)0x0) {
            free(ppuVar1[lVar2]);
          }
        }
        free(ppuVar1);
      }
      free(exr_image->tiles);
    }
    return 0;
  }
  return -3;
}

Assistant:

int FreeEXRImage(EXRImage *exr_image) {
  if (exr_image == NULL) {
    return TINYEXR_ERROR_INVALID_ARGUMENT;
  }

  if (exr_image->next_level) {
    FreeEXRImage(exr_image->next_level);
    delete exr_image->next_level;
  }

  for (int i = 0; i < exr_image->num_channels; i++) {
    if (exr_image->images && exr_image->images[i]) {
      free(exr_image->images[i]);
    }
  }

  if (exr_image->images) {
    free(exr_image->images);
  }

  if (exr_image->tiles) {
    for (int tid = 0; tid < exr_image->num_tiles; tid++) {
      for (int i = 0; i < exr_image->num_channels; i++) {
        if (exr_image->tiles[tid].images && exr_image->tiles[tid].images[i]) {
          free(exr_image->tiles[tid].images[i]);
        }
      }
      if (exr_image->tiles[tid].images) {
        free(exr_image->tiles[tid].images);
      }
    }
    free(exr_image->tiles);
  }

  return TINYEXR_SUCCESS;
}